

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::Transpose<4,_4>::doApply
          (IRet *__return_storage_ptr__,Transpose<4,_4> *this,EvalContext *param_1,IArgs *iargs)

{
  undefined7 uVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  int local_34;
  int local_30;
  int colNdx;
  int rowNdx;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  Transpose<4,_4> *this_local;
  IRet *ret;
  
  tcu::Matrix<tcu::Interval,_4,_4>::Matrix(__return_storage_ptr__);
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      pIVar2 = tcu::Matrix<tcu::Interval,_4,_4>::operator()(iargs->a,local_34,local_30);
      pIVar3 = tcu::Matrix<tcu::Interval,_4,_4>::operator()
                         (__return_storage_ptr__,local_30,local_34);
      uVar1 = *(undefined7 *)&pIVar2->field_0x1;
      pIVar3->m_hasNaN = pIVar2->m_hasNaN;
      *(undefined7 *)&pIVar3->field_0x1 = uVar1;
      pIVar3->m_lo = pIVar2->m_lo;
      pIVar3->m_hi = pIVar2->m_hi;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		IRet ret;

		for (int rowNdx = 0; rowNdx < Rows; ++rowNdx)
		{
			for (int colNdx = 0; colNdx < Columns; ++colNdx)
				ret(rowNdx, colNdx) = iargs.a(colNdx, rowNdx);
		}

		return ret;
	}